

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O0

void Vec_PtrSetEntry(Vec_Ptr_t *p,int i,void *Entry)

{
  void *Entry_local;
  int i_local;
  Vec_Ptr_t *p_local;
  
  Vec_PtrFillExtra(p,i + 1,(void *)0x0);
  Vec_PtrWriteEntry(p,i,Entry);
  return;
}

Assistant:

static inline void Vec_PtrSetEntry( Vec_Ptr_t * p, int i, void * Entry )
{
    Vec_PtrFillExtra( p, i + 1, NULL );
    Vec_PtrWriteEntry( p, i, Entry );
}